

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O2

bool SparseKeyTest<896,Blob<128>>
               (hashfunc<Blob<128>_> hash,int setbits,bool inclusive,bool testColl,bool testDist,
               bool drawDiagram)

{
  bool bVar1;
  undefined7 in_register_00000011;
  char *pcVar2;
  int iVar3;
  vector<Blob<128>,_std::allocator<Blob<128>_>_> hashes;
  keytype k;
  
  pcVar2 = "exactly";
  iVar3 = (int)CONCAT71(in_register_00000011,inclusive);
  if (iVar3 != 0) {
    pcVar2 = "up to";
  }
  printf("Keyset \'Sparse\' - %d-bit keys with %s %d bits set - ",0x380,pcVar2,(ulong)(uint)setbits)
  ;
  hashes.super__Vector_base<Blob<128>,_std::allocator<Blob<128>_>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  hashes.super__Vector_base<Blob<128>,_std::allocator<Blob<128>_>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  hashes.super__Vector_base<Blob<128>,_std::allocator<Blob<128>_>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  Blob<896>::Blob(&k);
  k.bytes[0x40] = '\0';
  k.bytes[0x41] = '\0';
  k.bytes[0x42] = '\0';
  k.bytes[0x43] = '\0';
  k.bytes[0x44] = '\0';
  k.bytes[0x45] = '\0';
  k.bytes[0x46] = '\0';
  k.bytes[0x47] = '\0';
  k.bytes[0x48] = '\0';
  k.bytes[0x49] = '\0';
  k.bytes[0x4a] = '\0';
  k.bytes[0x4b] = '\0';
  k.bytes[0x4c] = '\0';
  k.bytes[0x4d] = '\0';
  k.bytes[0x4e] = '\0';
  k.bytes[0x4f] = '\0';
  k.bytes[0x50] = '\0';
  k.bytes[0x51] = '\0';
  k.bytes[0x52] = '\0';
  k.bytes[0x53] = '\0';
  k.bytes[0x54] = '\0';
  k.bytes[0x55] = '\0';
  k.bytes[0x56] = '\0';
  k.bytes[0x57] = '\0';
  k.bytes[0x58] = '\0';
  k.bytes[0x59] = '\0';
  k.bytes[0x5a] = '\0';
  k.bytes[0x5b] = '\0';
  k.bytes[0x5c] = '\0';
  k.bytes[0x5d] = '\0';
  k.bytes[0x5e] = '\0';
  k.bytes[0x5f] = '\0';
  k.bytes[0x60] = '\0';
  k.bytes[0x61] = '\0';
  k.bytes[0x62] = '\0';
  k.bytes[99] = '\0';
  k.bytes[100] = '\0';
  k.bytes[0x65] = '\0';
  k.bytes[0x66] = '\0';
  k.bytes[0x67] = '\0';
  k.bytes[0x68] = '\0';
  k.bytes[0x69] = '\0';
  k.bytes[0x6a] = '\0';
  k.bytes[0x6b] = '\0';
  k.bytes[0x6c] = '\0';
  k.bytes[0x6d] = '\0';
  k.bytes[0x6e] = '\0';
  k.bytes[0x6f] = '\0';
  k.bytes[0] = '\0';
  k.bytes[1] = '\0';
  k.bytes[2] = '\0';
  k.bytes[3] = '\0';
  k.bytes[4] = '\0';
  k.bytes[5] = '\0';
  k.bytes[6] = '\0';
  k.bytes[7] = '\0';
  k.bytes[8] = '\0';
  k.bytes[9] = '\0';
  k.bytes[10] = '\0';
  k.bytes[0xb] = '\0';
  k.bytes[0xc] = '\0';
  k.bytes[0xd] = '\0';
  k.bytes[0xe] = '\0';
  k.bytes[0xf] = '\0';
  k.bytes[0x10] = '\0';
  k.bytes[0x11] = '\0';
  k.bytes[0x12] = '\0';
  k.bytes[0x13] = '\0';
  k.bytes[0x14] = '\0';
  k.bytes[0x15] = '\0';
  k.bytes[0x16] = '\0';
  k.bytes[0x17] = '\0';
  k.bytes[0x18] = '\0';
  k.bytes[0x19] = '\0';
  k.bytes[0x1a] = '\0';
  k.bytes[0x1b] = '\0';
  k.bytes[0x1c] = '\0';
  k.bytes[0x1d] = '\0';
  k.bytes[0x1e] = '\0';
  k.bytes[0x1f] = '\0';
  k.bytes[0x20] = '\0';
  k.bytes[0x21] = '\0';
  k.bytes[0x22] = '\0';
  k.bytes[0x23] = '\0';
  k.bytes[0x24] = '\0';
  k.bytes[0x25] = '\0';
  k.bytes[0x26] = '\0';
  k.bytes[0x27] = '\0';
  k.bytes[0x28] = '\0';
  k.bytes[0x29] = '\0';
  k.bytes[0x2a] = '\0';
  k.bytes[0x2b] = '\0';
  k.bytes[0x2c] = '\0';
  k.bytes[0x2d] = '\0';
  k.bytes[0x2e] = '\0';
  k.bytes[0x2f] = '\0';
  k.bytes[0x30] = '\0';
  k.bytes[0x31] = '\0';
  k.bytes[0x32] = '\0';
  k.bytes[0x33] = '\0';
  k.bytes[0x34] = '\0';
  k.bytes[0x35] = '\0';
  k.bytes[0x36] = '\0';
  k.bytes[0x37] = '\0';
  k.bytes[0x38] = '\0';
  k.bytes[0x39] = '\0';
  k.bytes[0x3a] = '\0';
  k.bytes[0x3b] = '\0';
  k.bytes[0x3c] = '\0';
  k.bytes[0x3d] = '\0';
  k.bytes[0x3e] = '\0';
  k.bytes[0x3f] = '\0';
  if (iVar3 != 0) {
    std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::resize(&hashes,1);
    (*hash.m_hash)(&k,0x70,0,
                   hashes.super__Vector_base<Blob<128>,_std::allocator<Blob<128>_>_>._M_impl.
                   super__Vector_impl_data._M_start);
  }
  SparseKeygenRecurse<Blob<896>,Blob<128>>(hash.m_hash,0,setbits,inclusive,&k,&hashes);
  printf("%d keys\n",
         (ulong)((long)hashes.super__Vector_base<Blob<128>,_std::allocator<Blob<128>_>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)hashes.super__Vector_base<Blob<128>,_std::allocator<Blob<128>_>_>._M_impl.
                      super__Vector_impl_data._M_start) >> 4);
  bVar1 = TestHashList<Blob<128>>(&hashes,drawDiagram,testColl,testDist,true,true);
  putchar(10);
  std::_Vector_base<Blob<128>,_std::allocator<Blob<128>_>_>::~_Vector_base
            (&hashes.super__Vector_base<Blob<128>,_std::allocator<Blob<128>_>_>);
  return bVar1;
}

Assistant:

bool SparseKeyTest ( hashfunc<hashtype> hash, const int setbits, bool inclusive,
                     bool testColl, bool testDist, bool drawDiagram )
{
  printf("Keyset 'Sparse' - %d-bit keys with %s %d bits set - ",keybits,
         inclusive ? "up to" : "exactly", setbits);

  typedef Blob<keybits> keytype;

  std::vector<hashtype> hashes;

  keytype k;
  memset(&k,0,sizeof(k));

  if(inclusive)
  {
    hashes.resize(1);
    hash(&k,sizeof(keytype),0,&hashes[0]);
  }

  SparseKeygenRecurse(hash,0,setbits,inclusive,k,hashes);

  printf("%d keys\n",(int)hashes.size());

  bool result = true;

  result &= TestHashList<hashtype>(hashes,drawDiagram,testColl,testDist);

  printf("\n");

  return result;
}